

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O2

string * __thiscall
CompoundExp::toString_abi_cxx11_(string *__return_storage_ptr__,CompoundExp *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*this->lhs->_vptr_Expression[3])(&local_38);
  std::operator+(&local_d8,'(',&local_38);
  std::operator+(&local_b8,&local_d8,' ');
  std::operator+(&local_98,&local_b8,&this->op);
  std::operator+(&local_78,&local_98,' ');
  (*this->rhs->_vptr_Expression[3])(&bStack_f8);
  std::operator+(&local_58,&local_78,&bStack_f8);
  std::operator+(__return_storage_ptr__,&local_58,')');
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompoundExp::toString() {
   return '(' + lhs->toString() + ' ' + op + ' ' + rhs->toString() + ')';
}